

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pool.cpp
# Opt level: O0

void __thiscall cppcms::session_pool::gc_job::~gc_job(gc_job *this)

{
  std::shared_ptr<booster::aio::deadline_timer>::~shared_ptr
            ((shared_ptr<booster::aio::deadline_timer> *)0x436bfc);
  std::enable_shared_from_this<cppcms::session_pool::gc_job>::~enable_shared_from_this
            ((enable_shared_from_this<cppcms::session_pool::gc_job> *)0x436c06);
  return;
}

Assistant:

gc_job(service *ser,double freq,session_pool *pool) :
		timer_(new booster::aio::deadline_timer(ser->get_io_service())),
		service_(ser),
		freq_(freq),
		pool_(pool)
	{
	}